

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

float stbir__filter_catmullrom(float x,float s)

{
  float fVar1;
  double dVar2;
  float s_local;
  float x_local;
  
  dVar2 = std::fabs((double)(ulong)(uint)x);
  fVar1 = SUB84(dVar2,0);
  if (1.0 <= fVar1) {
    if (2.0 <= fVar1) {
      s_local = 0.0;
    }
    else {
      s_local = -fVar1 * (fVar1 * (fVar1 * 0.5 + -2.5) + 4.0) + 2.0;
    }
  }
  else {
    s_local = -(fVar1 * fVar1) * (fVar1 * -1.5 + 2.5) + 1.0;
  }
  return s_local;
}

Assistant:

static float stbir__filter_catmullrom(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x < 1.0f)
        return 1 - x*x*(2.5f - 1.5f*x);
    else if (x < 2.0f)
        return 2 - x*(4 + x*(0.5f*x - 2.5f));

    return (0.0f);
}